

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V5_DimExtra::Write(ON_OBSOLETE_V5_DimExtra *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool local_21;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_OBSOLETE_V5_DimExtra *this_local;
  
  local_21 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,2);
  if (local_21) {
    local_21 = ON_BinaryArchive::WriteUuid(archive,&this->m_partent_uuid);
  }
  if (local_21 != false) {
    local_21 = ON_BinaryArchive::WriteInt(archive,this->m_arrow_position);
  }
  if (local_21 != false) {
    if (this->m_text_rects == (ON_OBSOLETE_V5_RECT *)0x0) {
      local_21 = ON_BinaryArchive::WriteInt(archive,0);
    }
    else {
      ON_BinaryArchive::WriteInt(archive,7);
      local_21 = ON_BinaryArchive::WriteInt(archive,0x1c,&this->m_text_rects->left);
    }
  }
  if (local_21 != false) {
    local_21 = ON_BinaryArchive::WriteDouble(archive,this->m_distance_scale);
  }
  if (local_21 != false) {
    local_21 = ON_BinaryArchive::WriteUuid(archive,&this->m_detail_measured);
  }
  bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
  if (!bVar1) {
    local_21 = false;
  }
  return local_21;
}

Assistant:

bool ON_OBSOLETE_V5_DimExtra::Write(ON_BinaryArchive& archive) const
{
  int major_version = 1;
  int minor_version = 2;
  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,major_version,minor_version);

  if(rc) rc = archive.WriteUuid( m_partent_uuid);
  if(rc) rc = archive.WriteInt( m_arrow_position);
  if(rc)
  {
    if( m_text_rects)
    {
      rc = archive.WriteInt( 7);
      rc = archive.WriteInt( 28, (const int*)m_text_rects);
    }
    else
      rc = archive.WriteInt( 0);

  }
  // 21 June 2010 Added distance scale, minor version 1
  if(rc) rc = archive.WriteDouble(m_distance_scale);

  // 27 Aug, 2014 Added detail measured, minor version 2
  if (rc) rc = archive.WriteUuid(m_detail_measured);

  if(!archive.EndWrite3dmChunk())
    rc = false;

  return rc;
}